

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void operator_suite::less(void)

{
  bool bVar1;
  initializer_list<int> input;
  iterator iVar2;
  iterator local_88;
  iterator local_78;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_88.current = 0x2c00000021;
  local_88.parent = (view_pointer)0x160000000b;
  input._M_len = 4;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x524,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x525,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x526,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x527,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x528,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52a,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52b,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52c,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52d,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52e,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x531,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x532,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x533,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x534,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x535,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x537,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x538,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x539,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53a,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53b,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x42);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53e,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53f,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x540,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x541,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x542,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x544,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x545,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x546,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x547,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x548,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x4d);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54b,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54c,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54d,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54e,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54f,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x551,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x552,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x553,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x554,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x555,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x58);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x558,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x559,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55a,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55b,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55c,"void operator_suite::less()",bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55e,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55f,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x560,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x561,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_78 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar2,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_78);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x562,"void operator_suite::less()",!bVar1);
  return;
}

Assistant:

void less()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(55);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(66);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(77);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(88);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));
}